

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O3

int emulator_disassemble(Emulator *e,Address addr,char *buffer,size_t size)

{
  uint uVar1;
  int iVar2;
  MemoryTypeAddressPair MVar3;
  long lVar4;
  undefined6 in_register_00000032;
  char bank [3];
  u8 data [3];
  char instr [120];
  undefined2 local_ae;
  undefined1 local_ac;
  u8 local_ab;
  u8 local_aa;
  u8 local_a9;
  char local_a8 [120];
  
  MVar3 = map_address(addr);
  local_ab = read_u8_pair(e,MVar3,TRUE);
  MVar3 = map_address(addr + 1);
  local_aa = read_u8_pair(e,MVar3,TRUE);
  MVar3 = map_address(addr + 2);
  local_a9 = read_u8_pair(e,MVar3,TRUE);
  iVar2 = disassemble_instr(&local_ab,local_a8,0x78);
  local_ac = 0;
  local_ae = 0x3f3f;
  lVar4 = 0x3070;
  if (((uint)CONCAT62(in_register_00000032,addr) < 0x4000) || (lVar4 = 0x3074, -1 < (short)addr)) {
    uVar1 = *(uint *)((long)(e->config).disable_sound + lVar4);
    local_ae = CONCAT11("0123456789abcdef"[uVar1 >> 0xe & 0xf],
                        "0123456789abcdef"[uVar1 >> 0x12 & 0xf]);
  }
  snprintf(buffer,size,"[%s]%#06x: %s",&local_ae,addr,local_a8);
  return iVar2 + (uint)(iVar2 == 0);
}

Assistant:

int emulator_disassemble(Emulator* e, Address addr, char* buffer, size_t size) {
  char instr[120];
  char hex[][3] = {"  ", "  ", "  "};

  u8 data[3] = {read_u8_raw(e, addr), read_u8_raw(e, addr + 1),
                read_u8_raw(e, addr + 2)};
  int num_bytes = disassemble_instr(data, instr, sizeof(instr));

  char bank[3] = "??";
  if (addr < 0x4000) {
    sprint_hex(bank, e->state.memory_map_state.rom_base[0] >> ROM_BANK_SHIFT);
  } else if (addr < 0x8000) {
    sprint_hex(bank, e->state.memory_map_state.rom_base[1] >> ROM_BANK_SHIFT);
  }

  snprintf(buffer, size, "[%s]%#06x: %s", bank, addr, instr);
  return num_bytes ? num_bytes : 1;
}